

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O2

unsigned_long evthread_posix_get_id(void)

{
  pthread_t pVar1;
  
  pVar1 = pthread_self();
  return pVar1;
}

Assistant:

static unsigned long
evthread_posix_get_id(void)
{
	union {
		pthread_t thr;
#if EVENT__SIZEOF_PTHREAD_T > EVENT__SIZEOF_LONG
		ev_uint64_t id;
#else
		unsigned long id;
#endif
	} r;
#if EVENT__SIZEOF_PTHREAD_T < EVENT__SIZEOF_LONG
	memset(&r, 0, sizeof(r));
#endif
	r.thr = pthread_self();
	return (unsigned long)r.id;
}